

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

reference __thiscall
slang::SmallVectorBase<slang::SmallVector<int,_10UL>_>::emplace_back<>
          (SmallVectorBase<slang::SmallVector<int,_10UL>_> *this)

{
  pointer pSVar1;
  size_type sVar2;
  ulong uVar3;
  SmallVector<int,_10UL> *__result;
  long *plVar4;
  reference __result_00;
  move_iterator<slang::SmallVector<int,_10UL>_*> __last;
  move_iterator<slang::SmallVector<int,_10UL>_*> __last_00;
  move_iterator<slang::SmallVector<int,_10UL>_*> __first;
  long lVar5;
  reference pSVar6;
  ulong uVar7;
  
  pSVar1 = this->data_;
  sVar2 = this->len;
  __last._M_current = pSVar1 + sVar2;
  if (sVar2 != this->cap) {
    ((__last._M_current)->super_SmallVectorBase<int>).data_ =
         (pointer)((__last._M_current)->super_SmallVectorBase<int>).firstElement;
    ((__last._M_current)->super_SmallVectorBase<int>).len = 0;
    ((__last._M_current)->super_SmallVectorBase<int>).cap = 10;
    this->len = sVar2 + 1;
    return pSVar1 + sVar2;
  }
  if (this->len == 0x1ffffffffffffff) {
    detail::throwLengthError();
  }
  uVar7 = this->len + 1;
  uVar3 = this->cap;
  if (uVar7 < uVar3 * 2) {
    uVar7 = uVar3 * 2;
  }
  if (0x1ffffffffffffff - uVar3 < uVar3) {
    uVar7 = 0x1ffffffffffffff;
  }
  lVar5 = (long)__last._M_current - (long)this->data_;
  __result = (SmallVector<int,_10UL> *)operator_new(uVar7 << 6);
  plVar4 = (long *)((long)__result + lVar5);
  *plVar4 = (long)(plVar4 + 3);
  plVar4[1] = 0;
  pSVar6 = (reference)(lVar5 + (long)__result);
  plVar4[2] = 10;
  __first._M_current = this->data_;
  __last_00._M_current = __first._M_current + this->len;
  __result_00 = __result;
  if (__last_00._M_current != __last._M_current) {
    std::__uninitialized_copy<false>::
    __uninit_copy<std::move_iterator<slang::SmallVector<int,10ul>*>,slang::SmallVector<int,10ul>*>
              (__first,__last,__result);
    __last_00._M_current = this->data_ + this->len;
    __result_00 = pSVar6 + 1;
    __first._M_current = __last._M_current;
  }
  std::__uninitialized_copy<false>::
  __uninit_copy<std::move_iterator<slang::SmallVector<int,10ul>*>,slang::SmallVector<int,10ul>*>
            (__first,__last_00,__result_00);
  cleanup(this,(EVP_PKEY_CTX *)__last_00._M_current);
  this->len = this->len + 1;
  this->cap = uVar7;
  this->data_ = __result;
  return pSVar6;
}

Assistant:

[[nodiscard]] constexpr iterator end() noexcept { return data_ + len; }